

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

char * BaseFileSearch(char *file,char *ext,bool lookfirstinprogdir)

{
  bool bVar1;
  int iVar2;
  FString *this;
  BYTE *pBVar3;
  char *pcVar4;
  FString dir;
  char *key;
  char *value;
  FString local_58;
  FString local_50;
  char *local_48;
  FString local_40;
  char *local_38;
  
  this = &local_58;
  if ((file != (char *)0x0) && (*file != '\0')) {
    if (lookfirstinprogdir) {
      pBVar3 = "/";
      if (progdir.Chars[(ulong)*(uint *)(progdir.Chars + -0xc) - 1] == '/') {
        pBVar3 = "";
      }
      mysnprintf(BaseFileSearch::wad,0x1000,"%s%s%s",progdir.Chars,pBVar3,file);
      bVar1 = DirEntryExists(BaseFileSearch::wad);
      if (bVar1) {
        return BaseFileSearch::wad;
      }
    }
    bVar1 = DirEntryExists(file);
    if (bVar1) {
      mysnprintf(BaseFileSearch::wad,0x1000,"%s",file);
      return BaseFileSearch::wad;
    }
    if ((GameConfig != (FGameConfigFile *)0x0) &&
       (bVar1 = FConfigFile::SetSection
                          (&GameConfig->super_FConfigFile,"FileSearch.Directories",false), bVar1)) {
      local_48 = FString::NullString.Nothing;
      pcVar4 = BaseFileSearch::wad;
      while (bVar1 = FConfigFile::NextInSection
                               (&GameConfig->super_FConfigFile,&local_50.Chars,&local_38), bVar1) {
        iVar2 = strcasecmp(local_50.Chars,"Path");
        if (iVar2 == 0) {
          local_58.Chars = local_48;
          FString::NullString.RefCount = FString::NullString.RefCount + 1;
          NicePath((char *)&local_40);
          FString::operator=(&local_58,&local_40);
          FString::~FString(&local_40);
          if ((ulong)((FNullStringData *)(local_58.Chars + -0xc))->Len != 0) {
            pBVar3 = "";
            if (local_58.Chars[(ulong)((FNullStringData *)(local_58.Chars + -0xc))->Len - 1] != '/')
            {
              pBVar3 = "/";
            }
            mysnprintf(BaseFileSearch::wad,0x1000,"%s%s%s",local_58.Chars,pBVar3,file);
            bVar1 = DirEntryExists(BaseFileSearch::wad);
            if (bVar1) goto LAB_00439055;
          }
          FString::~FString(&local_58);
        }
      }
    }
    if (ext != (char *)0x0) {
      FString::FString(&local_50,file);
      DefaultExtension(&local_50,ext);
      pcVar4 = BaseFileSearch(local_50.Chars,(char *)0x0,false);
      this = &local_50;
LAB_00439055:
      FString::~FString(this);
      return pcVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *BaseFileSearch (const char *file, const char *ext, bool lookfirstinprogdir)
{
	static char wad[PATH_MAX];

	if (file == NULL || *file == '\0')
	{
		return NULL;
	}
	if (lookfirstinprogdir)
	{
		mysnprintf (wad, countof(wad), "%s%s%s", progdir.GetChars(), progdir[progdir.Len() - 1] != '/' ? "/" : "", file);
		if (DirEntryExists (wad))
		{
			return wad;
		}
	}

	if (DirEntryExists (file))
	{
		mysnprintf (wad, countof(wad), "%s", file);
		return wad;
	}

	if (GameConfig != NULL && GameConfig->SetSection ("FileSearch.Directories"))
	{
		const char *key;
		const char *value;

		while (GameConfig->NextInSection (key, value))
		{
			if (stricmp (key, "Path") == 0)
			{
				FString dir;

				dir = NicePath(value);
				if (dir.IsNotEmpty())
				{
					mysnprintf (wad, countof(wad), "%s%s%s", dir.GetChars(), dir[dir.Len() - 1] != '/' ? "/" : "", file);
					if (DirEntryExists (wad))
					{
						return wad;
					}
				}
			}
		}
	}

	// Retry, this time with a default extension
	if (ext != NULL)
	{
		FString tmp = file;
		DefaultExtension (tmp, ext);
		return BaseFileSearch (tmp, NULL);
	}
	return NULL;
}